

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_componentNotEqualByComponent_Test::Equality_componentNotEqualByComponent_Test
          (Equality_componentNotEqualByComponent_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0012e428;
  return;
}

Assistant:

TEST(Equality, componentNotEqualByComponent)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::ComponentPtr cChild1 = libcellml::Component::create("child1");
    libcellml::ComponentPtr cChild2 = libcellml::Component::create("child2");

    c1->addComponent(cChild1);
    c2->addComponent(cChild2);

    EXPECT_FALSE(c1->equals(c2));
    EXPECT_FALSE(c2->equals(c1));
}